

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCException.h
# Opt level: O0

RuntimeException * __thiscall
GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
          (ExceptionReporter<GenICam_3_4::RuntimeException> *this,char *pFormat,...)

{
  int iVar1;
  char in_AL;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_RCX;
  char *in_RDX;
  long in_RSI;
  RuntimeException *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vap;
  char pBuffer [2048];
  undefined1 local_8e8 [24];
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined4 local_838;
  undefined4 local_834;
  undefined1 *local_830;
  undefined1 *local_828;
  char local_818 [2048];
  char *local_18;
  long local_10;
  RuntimeException *local_8;
  
  if (in_AL != '\0') {
    local_8b8 = in_XMM0_Qa;
    local_8a8 = in_XMM1_Qa;
    local_898 = in_XMM2_Qa;
    local_888 = in_XMM3_Qa;
    local_878 = in_XMM4_Qa;
    local_868 = in_XMM5_Qa;
    local_858 = in_XMM6_Qa;
    local_848 = in_XMM7_Qa;
  }
  local_828 = local_8e8;
  local_830 = &stack0x00000008;
  local_834 = 0x30;
  local_838 = 0x18;
  local_8d0 = in_RCX;
  local_8c8 = in_R8;
  local_8c0 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  vsnprintf(local_818,0x800,in_RDX,&local_838);
  pcVar2 = (char *)GenICam_3_4::gcstring::c_str();
  iVar1 = *(int *)(in_RSI + 0x50);
  pcVar3 = (char *)GenICam_3_4::gcstring::c_str();
  GenICam_3_4::RuntimeException::RuntimeException(in_RDI,local_818,pcVar2,iVar1,pcVar3);
  return in_RDI;
}

Assistant:

E Report(const char* pFormat, ...)
        {
            char pBuffer[2048];
            va_list vap;
            va_start(vap, pFormat);

#               if defined (_MSC_VER)
            vsnprintf_s(pBuffer, sizeof pBuffer, _TRUNCATE, pFormat, vap);
#               else 
            vsnprintf( pBuffer, sizeof pBuffer, pFormat, vap );
#               endif 

            va_end(vap);

            return E(pBuffer, m_SourceFileName.c_str(), m_SourceLine, m_ExceptionType.c_str());
        }